

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastSet.h
# Opt level: O1

CFastSet<unsigned_int> * __thiscall
CFastSet<unsigned_int>::operator=(CFastSet<unsigned_int> *this,CFastSet<unsigned_int> *set)

{
  int iVar1;
  uint *puVar2;
  uint *puVar3;
  long lVar4;
  ulong uVar5;
  
  if (this != set) {
    if (this->elementsSize != set->elementsSize) {
      if (this->elements != (uint *)0x0) {
        operator_delete__(this->elements);
      }
      iVar1 = set->elementsSize;
      this->elementsSize = iVar1;
      uVar5 = 0xffffffffffffffff;
      if (-1 < (long)iVar1) {
        uVar5 = (long)iVar1 * 4;
      }
      puVar3 = (uint *)operator_new__(uVar5);
      this->elements = puVar3;
    }
    if (0 < this->elementsSize) {
      puVar3 = set->elements;
      puVar2 = this->elements;
      lVar4 = 0;
      do {
        puVar2[lVar4] = puVar3[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 < this->elementsSize);
    }
  }
  return this;
}

Assistant:

CFastSet<T>& CFastSet<T>::operator=( const CFastSet& set )
{
	if( this != &set ) {
		if( elementsSize != set.elementsSize ) {
			delete[] elements;
			elementsSize = set.elementsSize;
			elements = new T[elementsSize];
		}
		for( int i = 0; i < elementsSize; i++ ) {
			elements[i] = set.elements[i];
		}
	}
	return *this;
}